

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

uint nelbereths_at(level *lev,xchar x,xchar y)

{
  engr *peVar1;
  char *pcVar2;
  uint uVar3;
  char *str;
  
  peVar1 = engr_at(lev,x,y);
  uVar3 = 0;
  if ((peVar1 != (engr *)0x0) && (uVar3 = 0, peVar1->engr_type != '\x06')) {
    str = peVar1->engr_txt;
    uVar3 = 0;
    while( true ) {
      pcVar2 = strstri(str,"Elbereth");
      if (pcVar2 == (char *)0x0) break;
      uVar3 = uVar3 + 1;
      str = str + 8;
    }
  }
  return uVar3;
}

Assistant:

static unsigned int nelbereths_at(struct level *lev, xchar x, xchar y)
{
	const char *s = "Elbereth";
	size_t s_len = strlen(s);
	struct engr *ep = engr_at(lev, x, y);
	unsigned int count = 0;
	const char *p;

	if (!ep || ep->engr_type == HEADSTONE)
	    return 0;

	p = ep->engr_txt;
	while (strstri(p, s)) {
	    count++;
	    p += s_len;
	}

	return count;
}